

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O3

int32_t __thiscall icu_63::BytesTrie::getNextBytes(BytesTrie *this,ByteSink *out)

{
  byte bVar1;
  byte *pos;
  uint uVar2;
  int32_t iVar3;
  byte *pbVar4;
  byte local_12;
  byte local_11;
  
  pbVar4 = this->pos_;
  iVar3 = 0;
  if (pbVar4 != (byte *)0x0) {
    if (this->remainingMatchLength_ < 0) {
      pos = pbVar4 + 1;
      bVar1 = *pbVar4;
      if (0x1f < bVar1) {
        if ((bVar1 & 1) != 0) {
          return 0;
        }
        if (0xa1 < bVar1) {
          if (bVar1 < 0xd8) {
            pos = pbVar4 + 2;
          }
          else if (bVar1 < 0xfc) {
            pos = pbVar4 + 3;
          }
          else {
            pos = pbVar4 + (ulong)((bVar1 >> 1 & 1) != 0) + 4;
          }
        }
        bVar1 = *pos;
        pos = pos + 1;
      }
      uVar2 = (uint)bVar1;
      if (uVar2 < 0x10) {
        if (uVar2 == 0) {
          uVar2 = (uint)*pos;
          pos = pos + 1;
        }
        getNextBranchBytes(pos,uVar2 + 1,out);
        return uVar2 + 1;
      }
      bVar1 = *pos;
      pbVar4 = &local_11;
    }
    else {
      bVar1 = *pbVar4;
      pbVar4 = &local_12;
    }
    *pbVar4 = bVar1;
    iVar3 = 1;
    (*out->_vptr_ByteSink[2])(out,pbVar4,1);
  }
  return iVar3;
}

Assistant:

int32_t
BytesTrie::getNextBytes(ByteSink &out) const {
    const uint8_t *pos=pos_;
    if(pos==NULL) {
        return 0;
    }
    if(remainingMatchLength_>=0) {
        append(out, *pos);  // Next byte of a pending linear-match node.
        return 1;
    }
    int32_t node=*pos++;
    if(node>=kMinValueLead) {
        if(node&kValueIsFinal) {
            return 0;
        } else {
            pos=skipValue(pos, node);
            node=*pos++;
            U_ASSERT(node<kMinValueLead);
        }
    }
    if(node<kMinLinearMatch) {
        if(node==0) {
            node=*pos++;
        }
        getNextBranchBytes(pos, ++node, out);
        return node;
    } else {
        // First byte of the linear-match node.
        append(out, *pos);
        return 1;
    }
}